

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O1

void ImGui::BulletTextV(char *fmt,__va_list_tag *args)

{
  char *buf;
  ImGuiWindow *pIVar1;
  ImVec2 pos;
  ImVec2 IVar2;
  ImGuiContext *pIVar3;
  bool bVar4;
  int iVar5;
  ImU32 col;
  float fVar6;
  ImRect bb;
  ImVec2 total_size;
  ImRect local_58;
  undefined1 local_48 [16];
  ImVec2 local_38;
  
  pIVar3 = GImGui;
  pIVar1 = GImGui->CurrentWindow;
  pIVar1->WriteAccessed = true;
  if (pIVar1->SkipItems == false) {
    buf = pIVar3->TempBuffer;
    iVar5 = ImFormatStringV(buf,0xc01,fmt,args);
    IVar2 = CalcTextSize(buf,pIVar3->TempBuffer + iVar5,false,-1.0);
    local_38.y = IVar2.y;
    local_38.x = 0.0;
    if (0.0 < IVar2.x) {
      fVar6 = (pIVar3->Style).FramePadding.x;
      local_38.x = fVar6 + fVar6 + IVar2.x;
    }
    local_38.x = pIVar3->FontSize + local_38.x;
    fVar6 = (pIVar1->DC).CursorPos.x;
    local_48 = ZEXT416((uint)((pIVar1->DC).CursorPos.y + (pIVar1->DC).CurrLineTextBaseOffset));
    ItemSize(&local_38,0.0);
    local_58.Max.x = fVar6 + local_38.x;
    local_58.Max.y = (float)local_48._0_4_ + local_38.y;
    local_58.Min.y = (float)local_48._0_4_;
    local_58.Min.x = fVar6;
    bVar4 = ItemAdd(&local_58,0,(ImRect *)0x0,0);
    if (bVar4) {
      col = GetColorU32(0,1.0);
      fVar6 = pIVar3->FontSize * 0.5;
      IVar2.y = fVar6 + local_58.Min.y;
      IVar2.x = (pIVar3->Style).FramePadding.x + fVar6 + local_58.Min.x;
      RenderBullet(pIVar1->DrawList,IVar2,col);
      fVar6 = (pIVar3->Style).FramePadding.x;
      pos.y = local_58.Min.y + 0.0;
      pos.x = fVar6 + fVar6 + pIVar3->FontSize + local_58.Min.x;
      RenderText(pos,buf,pIVar3->TempBuffer + iVar5,false);
    }
  }
  return;
}

Assistant:

bool ImGui::DragFloatRange2(const char* label, float* v_current_min, float* v_current_max, float v_speed, float v_min, float v_max, const char* format, const char* format_max, ImGuiSliderFlags flags)
{
    ImGuiWindow* window = GetCurrentWindow();
    if (window->SkipItems)
        return false;

    ImGuiContext& g = *GImGui;
    PushID(label);
    BeginGroup();
    PushMultiItemsWidths(2, CalcItemWidth());

    float min_min = (v_min >= v_max) ? -FLT_MAX : v_min;
    float min_max = (v_min >= v_max) ? *v_current_max : ImMin(v_max, *v_current_max);
    ImGuiSliderFlags min_flags = flags | ((min_min == min_max) ? ImGuiSliderFlags_ReadOnly : 0);
    bool value_changed = DragScalar("##min", ImGuiDataType_Float, v_current_min, v_speed, &min_min, &min_max, format, min_flags);
    PopItemWidth();
    SameLine(0, g.Style.ItemInnerSpacing.x);

    float max_min = (v_min >= v_max) ? *v_current_min : ImMax(v_min, *v_current_min);
    float max_max = (v_min >= v_max) ? FLT_MAX : v_max;
    ImGuiSliderFlags max_flags = flags | ((max_min == max_max) ? ImGuiSliderFlags_ReadOnly : 0);
    value_changed |= DragScalar("##max", ImGuiDataType_Float, v_current_max, v_speed, &max_min, &max_max, format_max ? format_max : format, max_flags);
    PopItemWidth();
    SameLine(0, g.Style.ItemInnerSpacing.x);

    TextEx(label, FindRenderedTextEnd(label));
    EndGroup();
    PopID();

    return value_changed;
}